

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O0

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  cmInstallTargetGenerator *pcVar1;
  cmTarget *this_00;
  byte bVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  char *pcVar6;
  ostream *poVar7;
  cmExportSet *this_01;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *this_02;
  reference ppcVar8;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  string local_128;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  string local_c0 [8];
  string dest;
  cmTargetExport *te;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range1;
  size_t n;
  string path;
  size_t numDotDot;
  string local_40 [8];
  string installDir;
  string *param_2_local;
  ostream *os_local;
  cmExportInstallAndroidMKGenerator *this_local;
  
  installDir.field_2._8_8_ = param_2;
  psVar5 = cmInstallExportGenerator::GetDestination_abi_cxx11_
                     ((this->super_cmExportInstallFileGenerator).IEGen);
  std::__cxx11::string::string(local_40,(string *)psVar5);
  std::operator<<(os,"LOCAL_PATH := $(call my-dir)\n");
  pcVar6 = (char *)std::__cxx11::string::c_str();
  path.field_2._8_8_ = cmsys::SystemTools::CountChar(pcVar6,'/');
  bVar2 = std::__cxx11::string::empty();
  path.field_2._8_8_ = (long)(int)(uint)((bVar2 & 1) == 0) + path.field_2._8_8_;
  std::__cxx11::string::string((string *)&n);
  for (__range1 = (vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)0x0;
      __range1 < (ulong)path.field_2._8_8_;
      __range1 = (vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *)
                 ((long)&(__range1->
                         super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    std::__cxx11::string::operator+=((string *)&n,"/..");
  }
  poVar7 = std::operator<<(os,"_IMPORT_PREFIX := ");
  poVar7 = std::operator<<(poVar7,"$(LOCAL_PATH)");
  poVar7 = std::operator<<(poVar7,(string *)&n);
  std::operator<<(poVar7,"\n\n");
  this_01 = cmInstallExportGenerator::GetExportSet((this->super_cmExportInstallFileGenerator).IEGen)
  ;
  this_02 = cmExportSet::GetTargetExports(this_01);
  __end1 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(this_02);
  te = (cmTargetExport *)
       std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(this_02);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                                     *)&te), bVar3) {
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
              ::operator*(&__end1);
    dest.field_2._8_8_ = *ppcVar8;
    TVar4 = cmGeneratorTarget::GetType(((cmTargetExport *)dest.field_2._8_8_)->Target);
    if (TVar4 != INTERFACE_LIBRARY) {
      std::__cxx11::string::string(local_c0);
      if (*(long *)(dest.field_2._8_8_ + 0x38) != 0) {
        pcVar1 = *(cmInstallTargetGenerator **)(dest.field_2._8_8_ + 0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
        cmInstallTargetGenerator::GetDestination(&local_e0,pcVar1,&local_100);
        std::__cxx11::string::operator=(local_c0,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator(&local_101);
      }
      if (*(long *)(dest.field_2._8_8_ + 0x28) != 0) {
        pcVar1 = *(cmInstallTargetGenerator **)(dest.field_2._8_8_ + 0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_149);
        cmInstallTargetGenerator::GetDestination(&local_128,pcVar1,&local_148);
        std::__cxx11::string::operator=(local_c0,(string *)&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
      }
      this_00 = (cmTarget *)**(undefined8 **)(dest.field_2._8_8_ + 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"__dest",&local_171);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmTarget::SetProperty(this_00,&local_170,pcVar6);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
      std::__cxx11::string::~string(local_c0);
    }
    __gnu_cxx::
    __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)&n);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := "
     << "$(LOCAL_PATH)" << path << "\n\n";
  for (cmTargetExport* te : *this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest.c_str());
  }
}